

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall
FSpecialFont::FSpecialFont
          (FSpecialFont *this,char *name,int first,int count,FTexture **lumplist,bool *notranslate,
          int lump)

{
  FTexture *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  CharData *pCVar7;
  void *pvVar8;
  BYTE *pBVar9;
  FFontChar1 *this_01;
  int yoffs;
  int height;
  FTexture *pic;
  int maxyoffs;
  FTexture **charlumps;
  int i;
  bool *notranslate_local;
  FTexture **lumplist_local;
  int count_local;
  int first_local;
  char *name_local;
  FSpecialFont *this_local;
  
  FFont::FFont(&this->super_FFont,lump);
  (this->super_FFont)._vptr_FFont = (_func_int **)&PTR__FSpecialFont_009fd458;
  memcpy(this->notranslate,notranslate,0x100);
  pcVar5 = copystring(name);
  (this->super_FFont).Name = pcVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)count;
  uVar6 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pCVar7 = (CharData *)operator_new__(uVar6);
  (this->super_FFont).Chars = pCVar7;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)count;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar6);
  pBVar9 = (BYTE *)operator_new__(0x100);
  (this->super_FFont).PatchRemap = pBVar9;
  (this->super_FFont).FirstChar = first;
  (this->super_FFont).LastChar = first + count + -1;
  (this->super_FFont).FontHeight = 0;
  (this->super_FFont).GlobalKerning = 0;
  (this->super_FFont).Next = FFont::FirstFont;
  pic._4_4_ = 0;
  charlumps._4_4_ = 0;
  FFont::FirstFont = &this->super_FFont;
  for (; charlumps._4_4_ < count; charlumps._4_4_ = charlumps._4_4_ + 1) {
    this_00 = lumplist[charlumps._4_4_];
    *(FTexture **)((long)pvVar8 + (long)charlumps._4_4_ * 8) = this_00;
    if (this_00 != (FTexture *)0x0) {
      iVar3 = FTexture::GetScaledHeight(this_00);
      iVar4 = FTexture::GetScaledTopOffset(this_00);
      if (pic._4_4_ < iVar4) {
        pic._4_4_ = iVar4;
      }
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if ((this->super_FFont).FontHeight < iVar4 + iVar3) {
        (this->super_FFont).FontHeight = iVar4 + iVar3;
      }
    }
    if (*(long *)((long)pvVar8 + (long)charlumps._4_4_ * 8) == 0) {
      (this->super_FFont).Chars[charlumps._4_4_].Pic = (FTexture *)0x0;
      (this->super_FFont).Chars[charlumps._4_4_].XMove = -0x80000000;
    }
    else {
      this_01 = (FFontChar1 *)operator_new(0x70);
      FFontChar1::FFontChar1(this_01,*(FTexture **)((long)pvVar8 + (long)charlumps._4_4_ * 8));
      (this->super_FFont).Chars[charlumps._4_4_].Pic = (FTexture *)this_01;
      iVar4 = FTexture::GetScaledWidth((this->super_FFont).Chars[charlumps._4_4_].Pic);
      (this->super_FFont).Chars[charlumps._4_4_].XMove = iVar4;
    }
  }
  if (((0x4e - first < 0) || (count <= 0x4e - first)) ||
     ((this->super_FFont).Chars[0x4e - first].Pic == (FTexture *)0x0)) {
    (this->super_FFont).SpaceWidth = 4;
  }
  else {
    (this->super_FFont).SpaceWidth = ((this->super_FFont).Chars[0x4e - first].XMove + 1) / 2;
  }
  FFont::FixXMoves(&this->super_FFont);
  (*(this->super_FFont)._vptr_FFont[4])();
  if (pvVar8 != (void *)0x0) {
    operator_delete__(pvVar8);
  }
  return;
}

Assistant:

FSpecialFont::FSpecialFont (const char *name, int first, int count, FTexture **lumplist, const bool *notranslate, int lump) : FFont(lump)
{
	int i;
	FTexture **charlumps;
	int maxyoffs;
	FTexture *pic;

	memcpy(this->notranslate, notranslate, 256*sizeof(bool));

	Name = copystring(name);
	Chars = new CharData[count];
	charlumps = new FTexture*[count];
	PatchRemap = new BYTE[256];
	FirstChar = first;
	LastChar = first + count - 1;
	FontHeight = 0;
	GlobalKerning = false;
	Next = FirstFont;
	FirstFont = this;

	maxyoffs = 0;

	for (i = 0; i < count; i++)
	{
		pic = charlumps[i] = lumplist[i];
		if (pic != NULL)
		{
			int height = pic->GetScaledHeight();
			int yoffs = pic->GetScaledTopOffset();

			if (yoffs > maxyoffs)
			{
				maxyoffs = yoffs;
			}
			height += abs (yoffs);
			if (height > FontHeight)
			{
				FontHeight = height;
			}
		}

		if (charlumps[i] != NULL)
		{
			Chars[i].Pic = new FFontChar1 (charlumps[i]);
			Chars[i].XMove = Chars[i].Pic->GetScaledWidth();
		}
		else
		{
			Chars[i].Pic = NULL;
			Chars[i].XMove = INT_MIN;
		}
	}

	// Special fonts normally don't have all characters so be careful here!
	if ('N'-first >= 0 && 'N'-first < count && Chars['N' - first].Pic != NULL)
	{
		SpaceWidth = (Chars['N' - first].XMove + 1) / 2;
	}
	else
	{
		SpaceWidth = 4;
	}

	FixXMoves();

	LoadTranslations();

	delete[] charlumps;
}